

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

bool __thiscall
Clasp::mt::SharedLitsClause::isReverseReason
          (SharedLitsClause *this,Solver *s,Literal p,uint32 maxL,uint32 maxN)

{
  bool bVar1;
  Literal *pLVar2;
  Solver *in_RSI;
  Solver *in_RDI;
  uint in_R8D;
  Literal *end;
  Literal *r;
  uint32 notSeen;
  undefined4 in_stack_ffffffffffffffa8;
  Var in_stack_ffffffffffffffac;
  Solver *in_stack_ffffffffffffffb0;
  Literal *local_30;
  uint local_24;
  
  local_24 = 0;
  local_30 = SharedLiterals::begin((SharedLiterals *)(in_RDI->model).ebo_.buf);
  pLVar2 = SharedLiterals::end((SharedLiterals *)in_stack_ffffffffffffffb0);
  do {
    if (local_30 == pLVar2) {
      return true;
    }
    bVar1 = Clasp::operator==((Literal *)in_stack_ffffffffffffffb0,
                              (Literal *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar1) {
      bVar1 = isRevLit(in_RDI,(Literal)local_30->rep_,
                       (uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
      if (!bVar1) {
        return false;
      }
      in_stack_ffffffffffffffb0 = in_RSI;
      Literal::var(local_30);
      bVar1 = Solver::seen(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      if ((!bVar1) && (local_24 = local_24 + 1, in_R8D < local_24)) {
        return false;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool SharedLitsClause::isReverseReason(const Solver& s, Literal p, uint32 maxL, uint32 maxN) {
	uint32 notSeen = 0;
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		if (*r == p) continue;
		if (!isRevLit(s, *r, maxL)) return false;
		if (!s.seen(r->var()) && ++notSeen > maxN) return false;
	}
	return true;
}